

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::PutVal
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t r,int64_t c,
          complex<long_double> *value)

{
  complex<long_double> **ppcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  complex<long_double> *pcVar5;
  long lVar6;
  long lVar7;
  longdouble in_ST0;
  
  lVar7 = r - c;
  if (lVar7 == 0 || r < c) {
    lVar7 = -(r - c);
    r = c;
  }
  ppcVar1 = (this->fElem).fStore;
  pcVar5 = ppcVar1[r];
  lVar6 = (long)ppcVar1[r + 1] - (long)pcVar5 >> 5;
  if (lVar6 <= lVar7) {
    cabsl();
    if ((longdouble)1e-16 <= ABS(in_ST0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size",0x1a);
      std::ostream::_M_insert<long>((long)&std::cout);
      std::ostream::flush();
      TPZMatrix<std::complex<long_double>_>::Error
                ("virtual int TPZSkylMatrix<std::complex<long double>>::PutVal(const int64_t, const int64_t, const TVar &) [TVar = std::complex<long double>]"
                 ,"Index out of range");
      pcVar5 = (this->fElem).fStore[r];
      goto LAB_00cc7d9d;
    }
    ppcVar1 = (this->fElem).fStore;
    pcVar5 = ppcVar1[r];
    lVar6 = (long)ppcVar1[r + 1] - (long)pcVar5 >> 5;
  }
  if (lVar6 <= lVar7) {
    return 1;
  }
LAB_00cc7d9d:
  uVar2 = *(undefined8 *)value->_M_value;
  uVar3 = *(undefined8 *)(value->_M_value + 8);
  uVar4 = *(undefined8 *)(value->_M_value + 0x18);
  *(undefined8 *)(pcVar5[lVar7]._M_value + 0x10) = *(undefined8 *)(value->_M_value + 0x10);
  *(undefined8 *)((long)(pcVar5[lVar7]._M_value + 0x10) + 8) = uVar4;
  *(undefined8 *)pcVar5[lVar7]._M_value = uVar2;
  *(undefined8 *)(pcVar5[lVar7]._M_value + 8) = uVar3;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}